

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

LongLong __thiscall
cmsys::SystemInformationImplementation::GetHostMemoryAvailable
          (SystemInformationImplementation *this,char *hostLimitEnvVarName)

{
  char *__nptr;
  longlong a;
  LongLong hostLimit;
  char *hostLimitEnvVarValue;
  LongLong memTotal;
  char *hostLimitEnvVarName_local;
  SystemInformationImplementation *this_local;
  
  hostLimitEnvVarValue = (char *)GetHostMemoryTotal(this);
  if (((hostLimitEnvVarName != (char *)0x0) &&
      (__nptr = getenv(hostLimitEnvVarName), __nptr != (char *)0x0)) && (a = atoll(__nptr), 0 < a))
  {
    hostLimitEnvVarValue = (char *)min<long_long>(a,(longlong)hostLimitEnvVarValue);
  }
  return (LongLong)hostLimitEnvVarValue;
}

Assistant:

SystemInformation::LongLong
SystemInformationImplementation::GetHostMemoryAvailable(const char *hostLimitEnvVarName)
{
  SystemInformation::LongLong memTotal=this->GetHostMemoryTotal();

  // the following mechanism is provided for systems that
  // apply resource limits across groups of processes.
  // this is of use on certain SMP systems (eg. SGI UV)
  // where the host has a large amount of ram but a given user's
  // access to it is severly restricted. The system will
  // apply a limit across a set of processes. Units are in KiB.
  if (hostLimitEnvVarName)
    {
    const char *hostLimitEnvVarValue=getenv(hostLimitEnvVarName);
    if (hostLimitEnvVarValue)
      {
      SystemInformation::LongLong hostLimit=atoLongLong(hostLimitEnvVarValue);
      if (hostLimit>0)
        {
        memTotal=min(hostLimit,memTotal);
        }
      }
    }

  return memTotal;
}